

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O1

CaseProd *
slang::ast::RandSeqProductionSymbol::createCaseProd(RsCaseSyntax *syntax,ASTContext *context)

{
  size_type sVar1;
  SyntaxNode *this;
  RsProdItemSyntax *pRVar2;
  Scope *pSVar3;
  Expression *args;
  span<const_slang::syntax::ExpressionSyntax_*const,_18446744073709551615UL> expressions_00;
  int iVar4;
  StandardRsCaseItemSyntax *pSVar5;
  DefaultRsCaseItemSyntax *pDVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CaseProd *pCVar7;
  logic_error *this_00;
  long *plVar8;
  pointer pCVar9;
  ExpressionSyntax *pEVar10;
  pointer pCVar11;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *pEVar12;
  EVP_PKEY_CTX *extraout_RDX_02;
  pointer ppRVar13;
  SyntaxKind *args_00;
  ulong uVar14;
  pointer ppRVar15;
  size_t index;
  pointer pPVar16;
  SmallVector<const_slang::ast::Expression_*,_5UL> bound;
  SmallVector<const_slang::ast::Expression_*,_5UL> group;
  SmallVector<const_slang::syntax::ExpressionSyntax_*,_5UL> expressions;
  SmallVector<slang::ast::RandSeqProductionSymbol::CaseItem,_8UL> items;
  SmallVector<slang::ast::RandSeqProductionSymbol::ProdItem,_8UL> prods;
  ASTContext *in_stack_fffffffffffffb98;
  Compilation *this_01;
  undefined1 local_448 [16];
  undefined1 local_438 [24];
  RandSeqProductionSymbol *pRStack_420;
  ExpressionSyntax *local_418;
  size_type local_410;
  undefined1 local_408 [8];
  ExpressionSyntax aEStack_400 [2];
  _Storage<slang::ast::RandSeqProductionSymbol::ProdItem,_true> local_3d8;
  char local_3b8;
  undefined1 local_3b0 [24];
  Expression *local_398 [5];
  undefined1 *local_370 [2];
  undefined1 local_360 [16];
  ExpressionSyntax *local_350;
  pointer ppEStack_348;
  string local_340;
  ExpressionSyntax *local_320;
  pointer ppEStack_318;
  undefined8 local_310;
  ExpressionSyntax local_308 [2];
  undefined1 local_2e0 [24];
  CaseItem aCStack_2c8 [8];
  SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdItem> local_148 [5];
  
  local_320 = local_308;
  ppEStack_318 = (pointer)0x0;
  local_310 = 5;
  local_148[0].data_ = (pointer)local_148[0].firstElement;
  local_148[0].len = 0;
  local_148[0].cap = 8;
  local_3b8 = '\0';
  sVar1 = (syntax->items).super_span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>.
          size_;
  if (sVar1 != 0) {
    ppRVar13 = (syntax->items).super_span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>
               .data_;
    ppRVar15 = ppRVar13 + sVar1;
    in_stack_fffffffffffffb98 = context;
    do {
      this = &(*ppRVar13)->super_SyntaxNode;
      if (this->kind == DefaultRsCaseItem) {
        if (local_3b8 == '\0') {
          pDVar6 = slang::syntax::SyntaxNode::as<slang::syntax::DefaultRsCaseItemSyntax>(this);
          pRVar2 = (pDVar6->item).ptr;
          if (pRVar2 == (RsProdItemSyntax *)0x0) {
            assert::assertFailed
                      ("ptr",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                       ,0x26,
                       "T slang::not_null<slang::syntax::RsProdItemSyntax *>::get() const [T = slang::syntax::RsProdItemSyntax *]"
                      );
          }
          createProdItem((ProdItem *)local_2e0,pRVar2,context);
          local_3d8._0_8_ = local_2e0._0_8_;
          local_3d8._M_value.target = (RandSeqProductionSymbol *)local_2e0._8_8_;
          local_3d8._M_value.args.data_ = (pointer)local_2e0._16_8_;
          local_3d8._M_value.args.size_ = (size_type)aCStack_2c8[0].expressions.data_;
          if (local_3b8 == '\0') {
            local_3b8 = '\x01';
          }
        }
      }
      else {
        if (this->kind != StandardRsCaseItem) {
          this_00 = (logic_error *)__cxa_allocate_exception(0x10);
          local_370[0] = local_360;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_370,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
                     ,"");
          plVar8 = (long *)std::__cxx11::string::append((char *)local_370);
          local_448._0_8_ = *plVar8;
          pCVar9 = (pointer)(plVar8 + 2);
          if ((pointer)local_448._0_8_ == pCVar9) {
            local_438._0_8_ = (pCVar9->expressions).data_;
            local_438._8_8_ = plVar8[3];
            local_448._0_8_ = (pointer)local_438;
          }
          else {
            local_438._0_8_ = (pCVar9->expressions).data_;
          }
          local_448._8_8_ = plVar8[1];
          *plVar8 = (long)pCVar9;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          std::__cxx11::to_string(&local_340,0x589);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_3b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_448,&local_340);
          plVar8 = (long *)std::__cxx11::string::append(local_3b0);
          local_418 = (ExpressionSyntax *)*plVar8;
          pEVar10 = (ExpressionSyntax *)(plVar8 + 2);
          if (local_418 == pEVar10) {
            local_408 = (undefined1  [8])(pEVar10->super_SyntaxNode).parent;
            aEStack_400[0].super_SyntaxNode.parent = (SyntaxNode *)plVar8[3];
            local_418 = (ExpressionSyntax *)local_408;
          }
          else {
            local_408 = (undefined1  [8])(pEVar10->super_SyntaxNode).parent;
          }
          local_410 = plVar8[1];
          *plVar8 = (long)pEVar10;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_418);
          local_2e0._0_8_ = *plVar8;
          pCVar11 = (pointer)(plVar8 + 2);
          if ((pointer)local_2e0._0_8_ == pCVar11) {
            local_2e0._16_8_ = (pCVar11->expressions).data_;
            aCStack_2c8[0].expressions.data_ = (pointer)plVar8[3];
            local_2e0._0_8_ = (pointer)(local_2e0 + 0x10);
          }
          else {
            local_2e0._16_8_ = (pCVar11->expressions).data_;
          }
          local_2e0._8_8_ = plVar8[1];
          *plVar8 = (long)pCVar11;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          std::logic_error::logic_error(this_00,(string *)local_2e0);
          __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
        pSVar5 = slang::syntax::SyntaxNode::as<slang::syntax::StandardRsCaseItemSyntax>(this);
        pRVar2 = (pSVar5->item).ptr;
        if (pRVar2 == (RsProdItemSyntax *)0x0) {
          assert::assertFailed
                    ("ptr",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                     ,0x26,
                     "T slang::not_null<slang::syntax::RsProdItemSyntax *>::get() const [T = slang::syntax::RsProdItemSyntax *]"
                    );
        }
        createProdItem((ProdItem *)local_2e0,pRVar2,context);
        context = in_stack_fffffffffffffb98;
        uVar14 = (pSVar5->expressions).elements.size_ + 1;
        in_stack_fffffffffffffb98 = context;
        if (1 < uVar14) {
          index = 0;
          do {
            local_418 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::
                        operator[](&pSVar5->expressions,index);
            SmallVectorBase<slang::syntax::ExpressionSyntax_const*>::
            emplace_back<slang::syntax::ExpressionSyntax_const*const&>
                      ((SmallVectorBase<slang::syntax::ExpressionSyntax_const*> *)&local_320,
                       &local_418);
            SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdItem>::
            emplace_back<slang::ast::RandSeqProductionSymbol::ProdItem_const&>
                      (local_148,(ProdItem *)local_2e0);
            index = index + 1;
            in_stack_fffffffffffffb98 = context;
          } while (uVar14 >> 1 != index);
        }
      }
      ppRVar13 = ppRVar13 + 1;
    } while (ppRVar13 != ppRVar15);
  }
  local_418 = aEStack_400;
  local_410 = 0;
  local_408 = (undefined1  [8])0x5;
  pEVar10 = (syntax->expr).ptr;
  if (pEVar10 == (ExpressionSyntax *)0x0) {
    assert::assertFailed
              ("ptr",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
               ,0x26,
               "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
              );
  }
  local_350 = local_320;
  ppEStack_348 = ppEStack_318;
  expressions_00.size_ = (size_type)&local_418;
  expressions_00.data_ = ppEStack_318;
  Expression::bindMembershipExpressions
            ((Expression *)context,(ASTContext *)0x74,Unknown,false,true,true,SUB81(pEVar10,0),
             local_320,expressions_00,
             (SmallVectorBase<const_slang::ast::Expression_*> *)in_stack_fffffffffffffb98);
  local_2e0._0_8_ = aCStack_2c8;
  local_2e0._8_8_ = (RandSeqProductionSymbol *)0x0;
  local_2e0._16_8_ = (pointer)0x8;
  local_3b0._0_8_ = local_398;
  local_3b0._8_8_ = 0;
  local_3b0._16_8_ = 5;
  pSVar3 = (context->scope).ptr;
  if (pSVar3 == (Scope *)0x0) {
    assert::assertFailed
              ("ptr",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
               ,0x26,
               "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]"
              );
  }
  this_01 = pSVar3->compilation;
  args = (Expression *)(local_418->super_SyntaxNode).parent;
  sVar1 = (syntax->items).super_span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>.
          size_;
  pEVar12 = extraout_RDX;
  if (sVar1 != 0) {
    ppRVar15 = (syntax->items).super_span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>
               .data_;
    ppRVar13 = ppRVar15 + sVar1;
    args_00 = &(local_418->super_SyntaxNode).kind;
    pPVar16 = local_148[0].data_;
    do {
      local_3b0._8_8_ = 0;
      if (((*ppRVar15)->super_SyntaxNode).kind == StandardRsCaseItem) {
        pSVar5 = slang::syntax::SyntaxNode::as<slang::syntax::StandardRsCaseItemSyntax>
                           (&(*ppRVar15)->super_SyntaxNode);
        pEVar12 = extraout_RDX_00;
        if (1 < (pSVar5->expressions).elements.size_ + 1) {
          uVar14 = 0;
          do {
            SmallVectorBase<slang::ast::Expression_const*>::
            emplace_back<slang::ast::Expression_const*const&>
                      ((SmallVectorBase<slang::ast::Expression_const*> *)local_3b0,
                       (Expression **)args_00);
            args_00 = args_00 + 2;
            uVar14 = uVar14 + 1;
            pEVar12 = extraout_RDX_01;
          } while (uVar14 < (pSVar5->expressions).elements.size_ + 1 >> 1);
        }
        iVar4 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                          ((SmallVectorBase<const_slang::ast::Expression_*> *)local_3b0,
                           (EVP_PKEY_CTX *)this_01,pEVar12);
        local_448._0_8_ = CONCAT44(extraout_var,iVar4);
        local_438._0_8_ = *(undefined8 *)pPVar16;
        local_438._8_8_ = pPVar16->target;
        local_438._16_8_ = (pPVar16->args).data_;
        pRStack_420 = (RandSeqProductionSymbol *)(pPVar16->args).size_;
        SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem>::
        emplace_back<slang::ast::RandSeqProductionSymbol::CaseItem>
                  ((SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem> *)local_2e0,
                   (CaseItem *)local_448);
        pPVar16 = pPVar16 + 1;
        pEVar12 = extraout_RDX_02;
      }
      ppRVar15 = ppRVar15 + 1;
    } while (ppRVar15 != ppRVar13);
  }
  local_3b0._8_8_ = 0;
  iVar4 = SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem>::copy
                    ((SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem> *)local_2e0,
                     (EVP_PKEY_CTX *)this_01,pEVar12);
  local_448._0_8_ = CONCAT44(extraout_var_00,iVar4);
  pCVar7 = BumpAllocator::
           emplace<slang::ast::RandSeqProductionSymbol::CaseProd,slang::ast::Expression_const&,nonstd::span_lite::span<slang::ast::RandSeqProductionSymbol::CaseItem,18446744073709551615ul>,std::optional<slang::ast::RandSeqProductionSymbol::ProdItem>&>
                     (&this_01->super_BumpAllocator,args,
                      (span<slang::ast::RandSeqProductionSymbol::CaseItem,_18446744073709551615UL> *
                      )local_448,
                      (optional<slang::ast::RandSeqProductionSymbol::ProdItem> *)&local_3d8._M_value
                     );
  if ((Expression **)local_3b0._0_8_ != local_398) {
    free((void *)local_3b0._0_8_);
  }
  if ((CaseItem *)local_2e0._0_8_ != aCStack_2c8) {
    free((void *)local_2e0._0_8_);
  }
  if (local_418 != aEStack_400) {
    free(local_418);
  }
  if (local_148[0].data_ != (pointer)local_148[0].firstElement) {
    free(local_148[0].data_);
  }
  if (local_320 != local_308) {
    free(local_320);
  }
  return pCVar7;
}

Assistant:

const RandSeqProductionSymbol::CaseProd& RandSeqProductionSymbol::createCaseProd(
    const RsCaseSyntax& syntax, const ASTContext& context) {

    SmallVector<const ExpressionSyntax*> expressions;
    SmallVector<ProdItem, 8> prods;
    std::optional<ProdItem> defItem;

    for (auto item : syntax.items) {
        switch (item->kind) {
            case SyntaxKind::StandardRsCaseItem: {
                auto& sci = item->as<StandardRsCaseItemSyntax>();
                auto pi = createProdItem(*sci.item, context);
                for (auto es : sci.expressions) {
                    expressions.push_back(es);
                    prods.push_back(pi);
                }
                break;
            }
            case SyntaxKind::DefaultRsCaseItem:
                // The parser already errored for duplicate defaults,
                // so just ignore if it happens here.
                if (!defItem)
                    defItem = createProdItem(*item->as<DefaultRsCaseItemSyntax>().item, context);
                break;
            default:
                ASSUME_UNREACHABLE;
        }
    }

    SmallVector<const Expression*> bound;
    Expression::bindMembershipExpressions(context, TokenKind::CaseKeyword,
                                          /* requireIntegral */ false,
                                          /* unwrapUnpacked */ false,
                                          /* allowTypeReferences */ true, /* allowOpenRange */ true,
                                          *syntax.expr, expressions, bound);

    SmallVector<CaseItem, 8> items;
    SmallVector<const Expression*> group;
    auto& comp = context.getCompilation();
    auto boundIt = bound.begin();
    auto prodIt = prods.begin();
    auto expr = *boundIt++;

    for (auto item : syntax.items) {
        switch (item->kind) {
            case SyntaxKind::StandardRsCaseItem: {
                auto& sci = item->as<StandardRsCaseItemSyntax>();
                for (size_t i = 0; i < sci.expressions.size(); i++)
                    group.push_back(*boundIt++);

                items.push_back({group.copy(comp), *prodIt++});
                group.clear();
                break;
            }
            default:
                break;
        }
    }

    return *comp.emplace<CaseProd>(*expr, items.copy(comp), defItem);
}